

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

void __thiscall
duckdb::ZSTDCompressionState::NewPage(ZSTDCompressionState *this,bool additional_data_page)

{
  block_id_t bVar1;
  BufferHandle *handle;
  
  bVar1 = FinalizePage(this);
  handle = GetExtraPageBuffer(this,this->block_id);
  this->block_id = bVar1;
  SetCurrentBuffer(this,handle);
  ResetOutBuffer(this);
  return;
}

Assistant:

void NewPage(bool additional_data_page = false) {
		block_id_t new_id = FinalizePage();
		block_id_t current_block_id = block_id;
		auto &buffer = GetExtraPageBuffer(current_block_id);
		block_id = new_id;
		SetCurrentBuffer(buffer);
		ResetOutBuffer();
	}